

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
util::exception::exception<CylHead&,char_const(&)[46]>
          (exception *this,CylHead *args,char (*args_1) [46])

{
  char (*in_RCX) [46];
  string local_30;
  
  make_string<CylHead&,char_const(&)[46]>(&local_30,(util *)args,(CylHead *)args_1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}